

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O2

bool __thiscall
dap::FieldSerializer::field<char[9],void>(FieldSerializer *this,string *name,char (*v) [9])

{
  int iVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(dap::Serializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:248:28)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(dap::Serializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:248:28)>
             ::_M_manager;
  local_28._M_unused._M_object = v;
  iVar1 = (*this->_vptr_FieldSerializer[2])(this,name,&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return SUB41(iVar1,0);
}

Assistant:

bool FieldSerializer::field(const std::string& name, const T& v) {
  return this->field(name, [&](Serializer* s) { return s->serialize(v); });
}